

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parserInternals.c
# Opt level: O2

xmlParserErrors
xmlInputSetEncodingHandler(xmlParserInputPtr input,xmlCharEncodingHandlerPtr handler)

{
  xmlParserInputBufferPtr input_00;
  xmlCharEncodingHandler *handler_00;
  xmlBufPtr buf;
  int iVar1;
  xmlCharEncError xVar2;
  size_t in_RAX;
  xmlBufPtr buf_00;
  xmlParserErrors xVar3;
  size_t len;
  size_t nbchars;
  
  if ((input == (xmlParserInputPtr)0x0) ||
     (input_00 = input->buf, input_00 == (xmlParserInputBufferPtr)0x0)) {
    xmlCharEncCloseFunc(handler);
    return XML_ERR_ARGUMENT;
  }
  *(byte *)&input->flags = (byte)input->flags | 1;
  xVar3 = XML_ERR_OK;
  nbchars = in_RAX;
  if (handler != (xmlCharEncodingHandlerPtr)0x0) {
    iVar1 = xmlStrcasecmp((xmlChar *)handler->name,"UTF-8");
    if (iVar1 != 0) goto LAB_0013fcb0;
    xmlCharEncCloseFunc(handler);
  }
  handler = (xmlCharEncodingHandler *)0x0;
LAB_0013fcb0:
  handler_00 = input_00->encoder;
  if (handler_00 != handler) {
    if (handler_00 == (xmlCharEncodingHandler *)0x0) {
      buf_00 = xmlBufCreate(6000);
      if (buf_00 == (xmlBufPtr)0x0) {
        xmlCharEncCloseFunc(handler);
        xVar3 = XML_ERR_NO_MEMORY;
      }
      else {
        input_00->encoder = handler;
        buf = input_00->buffer;
        input_00->raw = buf;
        input_00->buffer = buf_00;
        xVar3 = XML_ERR_OK;
        if (input->base < input->end) {
          len = (long)input->cur - (long)input->base;
          xmlBufShrink(buf,len);
          input->consumed = input->consumed + len;
          input_00->rawconsumed = len;
          xVar3 = XML_ERR_OK;
          nbchars = -(ulong)(((uint)input->flags >> 6 & 1) != 0) | 4000;
          xVar2 = xmlCharEncInput(input_00,&nbchars,0);
          if (xVar2 != XML_ENC_ERR_SUCCESS) {
            xVar3 = input_00->error;
          }
          buf_00 = input_00->buffer;
        }
        xmlBufResetInput(buf_00,input);
      }
    }
    else {
      xmlCharEncCloseFunc(handler_00);
      input_00->encoder = handler;
    }
  }
  return xVar3;
}

Assistant:

xmlParserErrors
xmlInputSetEncodingHandler(xmlParserInputPtr input,
                           xmlCharEncodingHandlerPtr handler) {
    xmlParserInputBufferPtr in;
    xmlBufPtr buf;
    xmlParserErrors code = XML_ERR_OK;

    if ((input == NULL) || (input->buf == NULL)) {
        xmlCharEncCloseFunc(handler);
	return(XML_ERR_ARGUMENT);
    }
    in = input->buf;

    input->flags |= XML_INPUT_HAS_ENCODING;

    /*
     * UTF-8 requires no encoding handler.
     */
    if ((handler != NULL) &&
        (xmlStrcasecmp(BAD_CAST handler->name, BAD_CAST "UTF-8") == 0)) {
        xmlCharEncCloseFunc(handler);
        handler = NULL;
    }

    if (in->encoder == handler)
        return(XML_ERR_OK);

    if (in->encoder != NULL) {
        /*
         * Switching encodings during parsing is a really bad idea,
         * but Chromium can switch between ISO-8859-1 and UTF-16 before
         * separate calls to xmlParseChunk.
         *
         * TODO: We should check whether the "raw" input buffer is empty and
         * convert the old content using the old encoder.
         */

        xmlCharEncCloseFunc(in->encoder);
        in->encoder = handler;
        return(XML_ERR_OK);
    }

    buf = xmlBufCreate(XML_IO_BUFFER_SIZE);
    if (buf == NULL) {
        xmlCharEncCloseFunc(handler);
        return(XML_ERR_NO_MEMORY);
    }

    in->encoder = handler;
    in->raw = in->buffer;
    in->buffer = buf;

    /*
     * Is there already some content down the pipe to convert ?
     */
    if (input->end > input->base) {
        size_t processed;
        size_t nbchars;
        xmlCharEncError res;

        /*
         * Shrink the current input buffer.
         * Move it as the raw buffer and create a new input buffer
         */
        processed = input->cur - input->base;
        xmlBufShrink(in->raw, processed);
        input->consumed += processed;
        in->rawconsumed = processed;

        /*
         * If we're push-parsing, we must convert the whole buffer.
         *
         * If we're pull-parsing, we could be parsing from a huge
         * memory buffer which we don't want to convert completely.
         */
        if (input->flags & XML_INPUT_PROGRESSIVE)
            nbchars = SIZE_MAX;
        else
            nbchars = 4000 /* MINLEN */;
        res = xmlCharEncInput(in, &nbchars, /* flush */ 0);
        if (res != XML_ENC_ERR_SUCCESS)
            code = in->error;
    }

    xmlBufResetInput(in->buffer, input);

    return(code);
}